

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

BinaryPolynomialModel<unsigned_int,_double> * __thiscall
cimod::BinaryPolynomialModel<unsigned_int,double>::FromSerializable<unsigned_int,double>
          (BinaryPolynomialModel<unsigned_int,_double> *__return_storage_ptr__,
          BinaryPolynomialModel<unsigned_int,double> *this,json *input)

{
  bool bVar1;
  const_reference pvVar2;
  runtime_error *this_00;
  Vartype vartype;
  _Vector_base<double,_std::allocator<double>_> local_60;
  PolynomialKeyList<std::size_t> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at<const_char_(&)[5],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)this,(char (*) [5])0x1c8d3a);
  bVar1 = nlohmann::json_abi_v3_11_2::operator!=<const_char_*,_0>(pvVar2,"BinaryPolynomialModel");
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Type must be \"BinaryPolynomialModel\".\n");
LAB_0018a51f:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at<const_char_(&)[8],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)this,(char (*) [8])0x1b23aa);
  bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>(pvVar2,"SPIN");
  vartype = SPIN;
  if (!bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[8],_0>
                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)this,(char (*) [8])0x1b23aa);
    bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>(pvVar2,"BINARY");
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Variable type must be SPIN or BINARY.");
      goto LAB_0018a51f;
    }
    vartype = BINARY;
  }
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"variables");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_0>(&local_30,pvVar2);
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"poly_key_distance_list");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  get_impl<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_0>
            (&local_48,pvVar2);
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this,"poly_value_list");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::vector<double,_std::allocator<double>_>,_0>(&local_60,pvVar2);
  BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel
            (__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30
             ,&local_48,(PolynomialValueList<double> *)&local_60,vartype);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

static BinaryPolynomialModel<IndexType_serial, FloatType_serial> FromSerializable( const nlohmann::json &input ) {
      if ( input.at( "type" ) != "BinaryPolynomialModel" ) {
        throw std::runtime_error( "Type must be \"BinaryPolynomialModel\".\n" );
      }
      Vartype vartype;
      if ( input.at( "vartype" ) == "SPIN" ) {
        vartype = Vartype::SPIN;
      } else if ( input.at( "vartype" ) == "BINARY" ) {
        vartype = Vartype::BINARY;
      } else {
        throw std::runtime_error( "Variable type must be SPIN or BINARY." );
      }
      return BinaryPolynomialModel<IndexType_serial, FloatType_serial>(
          input[ "variables" ], input[ "poly_key_distance_list" ], input[ "poly_value_list" ], vartype );
    }